

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_blob_reopen(sqlite3_blob *pBlob,sqlite3_int64 iRow)

{
  sqlite3 *db;
  int iVar1;
  char *in_RAX;
  char *zFormat;
  Incrblob *p;
  char *zErr;
  
  if (pBlob != (sqlite3_blob *)0x0) {
    db = *(sqlite3 **)(pBlob + 0x20);
    zErr = in_RAX;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    if (*(long *)(pBlob + 0x18) == 0) {
      iVar1 = 4;
    }
    else {
      *(undefined4 *)(*(long *)(pBlob + 0x18) + 0x34) = 0;
      iVar1 = blobSeekToRow((Incrblob *)pBlob,iRow,&zErr);
      if (iVar1 != 0) {
        zFormat = "%s";
        if (zErr == (char *)0x0) {
          zFormat = (char *)0x0;
        }
        sqlite3ErrorWithMsg(db,iVar1,zFormat,zErr);
        sqlite3DbFree(db,zErr);
      }
    }
    iVar1 = sqlite3ApiExit(db,iVar1);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    return iVar1;
  }
  iVar1 = sqlite3MisuseError(0x19174);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_blob_reopen(sqlite3_blob *pBlob, sqlite3_int64 iRow){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);

  if( p->pStmt==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    char *zErr;
    ((Vdbe*)p->pStmt)->rc = SQLITE_OK;
    rc = blobSeekToRow(p, iRow, &zErr);
    if( rc!=SQLITE_OK ){
      sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : (char*)0), zErr);
      sqlite3DbFree(db, zErr);
    }
    assert( rc!=SQLITE_SCHEMA );
  }

  rc = sqlite3ApiExit(db, rc);
  assert( rc==SQLITE_OK || p->pStmt==0 );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}